

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void __thiscall
testing::internal::TypeParameterizedTestSuiteRegistry::RegisterTestSuite
          (TypeParameterizedTestSuiteRegistry *this,char *test_suite_name,
          CodeLocation *code_location)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  allocator<char> local_91;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  undefined8 local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  int local_70;
  TypeParameterizedTestSuiteInfo local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,test_suite_name,&local_91);
  local_90 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(code_location->file)._M_dataplus._M_p;
  paVar1 = &(code_location->file).field_2;
  if (local_90 == paVar1) {
    local_80._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_80._8_8_ = *(undefined8 *)((long)&(code_location->file).field_2 + 8);
    local_90 = &local_80;
  }
  else {
    local_80._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_68.code_location.file._M_string_length = (code_location->file)._M_string_length;
  (code_location->file)._M_dataplus._M_p = (pointer)paVar1;
  (code_location->file)._M_string_length = 0;
  (code_location->file).field_2._M_local_buf[0] = '\0';
  local_70 = code_location->line;
  paVar1 = &local_68.code_location.file.field_2;
  if (local_90 == &local_80) {
    local_68.code_location.file.field_2._8_8_ = local_80._8_8_;
    local_68.code_location.file._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_68.code_location.file._M_dataplus._M_p = (pointer)local_90;
  }
  local_68.code_location.file.field_2._M_allocated_capacity = local_80._M_allocated_capacity;
  local_88 = 0;
  local_80._M_allocated_capacity = local_80._M_allocated_capacity & 0xffffffffffffff00;
  local_68.instantiated = false;
  local_90 = &local_80;
  local_68.code_location.line = local_70;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>>>
  ::
  _M_emplace_unique<std::__cxx11::string,testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>>>
              *)this,&local_38,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.code_location.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_68.code_location.file._M_dataplus._M_p,
                    local_68.code_location.file.field_2._M_allocated_capacity + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void TypeParameterizedTestSuiteRegistry::RegisterTestSuite(
    const char* test_suite_name, CodeLocation code_location) {
  suites_.emplace(std::string(test_suite_name),
                  TypeParameterizedTestSuiteInfo(std::move(code_location)));
}